

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

int __thiscall kj::anon_unknown_36::WebSocketPipeImpl::close(WebSocketPipeImpl *this,int __fd)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  undefined8 *puVar4;
  Coroutine<void> *this_00;
  WebSocket *pWVar5;
  Promise<void> *promise;
  Promise<void> *pPVar6;
  size_t sVar7;
  char *in_RCX;
  uint16_t *puVar8;
  StringPtr *this_01;
  suspend_never *this_02;
  long *plVar9;
  PromiseAwaiter<void> *__return_storage_ptr__;
  PromiseAwaiter<void> *__return_storage_ptr___00;
  kj *this_03;
  OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
  *adapterConstructorParams_1;
  suspend_always *this_04;
  uint16_t in_DX;
  int __fd_00;
  undefined4 in_register_00000034;
  undefined8 in_R8;
  uint16_t code_local;
  WebSocketPipeImpl *this_local;
  StringPtr reason_local;
  
  puVar4 = (undefined8 *)operator_new(0x648);
  *puVar4 = close;
  puVar4[1] = close;
  puVar8 = (uint16_t *)((long)puVar4 + 0x63c);
  this_01 = (StringPtr *)(puVar4 + 0xbf);
  this_02 = (suspend_never *)((long)puVar4 + 0x63f);
  plVar9 = puVar4 + 0xc2;
  __return_storage_ptr__ = (PromiseAwaiter<void> *)(puVar4 + 0x47);
  pPVar6 = (Promise<void> *)(puVar4 + 0xc4);
  __return_storage_ptr___00 = (PromiseAwaiter<void> *)(puVar4 + 0x7e);
  this_03 = (kj *)(puVar4 + 0xc5);
  adapterConstructorParams_1 =
       (OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
        *)(puVar4 + 0xb5);
  this_04 = (suspend_always *)(puVar4 + 200);
  this_00 = (Coroutine<void> *)(puVar4 + 2);
  puVar4[0xc6] = CONCAT44(in_register_00000034,__fd);
  *puVar8 = in_DX;
  (this_01->content).ptr = in_RCX;
  puVar4[0xc0] = in_R8;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar4 + 0xb9),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"close",0xf1f,0x15);
  kj::_::Coroutine<void>::Coroutine(this_00,*(SourceLocation *)(puVar4 + 0xb9));
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar2 = std::__n4861::suspend_never::await_ready(this_02);
  __fd_00 = (int)puVar4;
  if (bVar2) {
    std::__n4861::suspend_never::await_resume(this_02);
    pWVar5 = kj::_::readMaybe<kj::WebSocket>((Maybe<kj::WebSocket_&> *)(puVar4[0xc6] + 0x28));
    *plVar9 = (long)pWVar5;
    if (*plVar9 == 0) {
      ((ClosePtr *)(puVar4 + 0xbc))->code = *puVar8;
      puVar4[0xbd] = (this_01->content).ptr;
      puVar4[0xbe] = puVar4[0xc0];
      OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
      ::OneOf<kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr,int>
                ((OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
                  *)adapterConstructorParams_1,(ClosePtr *)(puVar4 + 0xbc));
      newAdaptedPromise<void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend,kj::(anonymous_namespace)::WebSocketPipeImpl&,kj::OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>>
                (this_03,(WebSocketPipeImpl *)puVar4[0xc6],adapterConstructorParams_1);
      pPVar6 = kj::_::Coroutine<void>::await_transform<kj::Promise<void>>
                         (this_00,(Promise<void> *)this_03);
      co_await<void>(__return_storage_ptr___00,pPVar6);
      bVar2 = kj::_::PromiseAwaiterBase::await_ready
                        ((PromiseAwaiterBase *)__return_storage_ptr___00);
      if (!bVar2) {
        *(undefined1 *)((long)puVar4 + 0x63e) = 2;
        uVar3 = _GLOBAL__N_1::WebSocketPipeImpl::close(__return_storage_ptr___00,__fd_00);
        if ((uVar3 & 1) != 0) goto LAB_0065c1f1;
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___00);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___00);
      Promise<void>::~Promise((Promise<void> *)this_03);
      OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
      ::~OneOf(adapterConstructorParams_1);
    }
    else {
      puVar4[0xc3] = *plVar9;
      plVar9 = (long *)puVar4[0xc3];
      (**(code **)(*plVar9 + 0x10))(pPVar6,plVar9,*puVar8,(this_01->content).ptr,puVar4[0xc0]);
      promise = kj::_::Coroutine<void>::await_transform<kj::Promise<void>>(this_00,pPVar6);
      co_await<void>(__return_storage_ptr__,promise);
      bVar2 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
      if (!bVar2) {
        *(undefined1 *)((long)puVar4 + 0x63e) = 1;
        uVar3 = _GLOBAL__N_1::WebSocketPipeImpl::close(__return_storage_ptr__,__fd_00);
        if ((uVar3 & 1) != 0) goto LAB_0065c1f1;
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
      Promise<void>::~Promise(pPVar6);
    }
    lVar1 = puVar4[0xc6];
    sVar7 = StringPtr::size(this_01);
    *(size_t *)(lVar1 + 0x40) = sVar7 + 2 + *(long *)(lVar1 + 0x40);
    kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
              ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
    bVar2 = std::__n4861::suspend_always::await_ready(this_04);
    if (bVar2) {
      std::__n4861::suspend_always::await_resume(this_04);
      kj::_::Coroutine<void>::~Coroutine(this_00);
      if (puVar4 != (undefined8 *)0x0) {
        operator_delete(puVar4,0x648);
      }
    }
    else {
      *puVar4 = 0;
      *(undefined1 *)((long)puVar4 + 0x63e) = 3;
      _GLOBAL__N_1::WebSocketPipeImpl::close(this_04,__fd_00);
    }
  }
  else {
    *(undefined1 *)((long)puVar4 + 0x63e) = 0;
    _GLOBAL__N_1::WebSocketPipeImpl::close(this_02,__fd_00);
  }
LAB_0065c1f1:
  return (int)this;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
    KJ_IF_SOME(s, state) {
      co_await s.close(code, reason);
    } else {
      co_await newAdaptedPromise<void, BlockedSend>(*this, MessagePtr(ClosePtr { code, reason }));
    }